

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Worker::WorkerThread::~WorkerThread(WorkerThread *this)

{
  pthread_t pVar1;
  pthread_t pVar2;
  
  pVar1 = (this->thread_)._M_id._M_thread;
  pVar2 = pthread_self();
  if (pVar1 == pVar2) {
    std::thread::detach();
  }
  std::thread::~thread(&this->thread_);
  return;
}

Assistant:

~WorkerThread() {
                if (thread_.get_id() == std::this_thread::get_id()) {
                    // Allow the thread to finish exiting the lambda
                    thread_.detach();
                }
            }